

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

ssize_t get_uncompressed_data(archive_read *a,void **buff,size_t size,size_t minimum)

{
  void *pvVar1;
  ssize_t sVar2;
  archive_read *local_40;
  ssize_t bytes_avail;
  _7zip *zip;
  size_t minimum_local;
  size_t size_local;
  void **buff_local;
  archive_read *a_local;
  
  bytes_avail = (ssize_t)a->format->data;
  zip = (_7zip *)minimum;
  minimum_local = size;
  size_local = (size_t)buff;
  buff_local = (void **)a;
  if ((*(long *)(bytes_avail + 0x128) == 0) && (*(long *)(bytes_avail + 0x130) == -1)) {
    pvVar1 = __archive_read_ahead(a,minimum,(ssize_t *)&local_40);
    *(void **)size_local = pvVar1;
    if ((long)local_40 < 1) {
      archive_set_error((archive *)buff_local,0x54,"Truncated 7-Zip file data");
      return -0x1e;
    }
    if (*(archive_read **)(bytes_avail + 0xf0) < local_40) {
      local_40 = *(archive_read **)(bytes_avail + 0xf0);
    }
    if (minimum_local < local_40) {
      local_40 = (archive_read *)minimum_local;
    }
    *(archive_read **)(bytes_avail + 0x120) = local_40;
  }
  else {
    if (*(long *)(bytes_avail + 0xe0) == 0) {
      archive_set_error(&a->archive,-1,"Damaged 7-Zip archive");
      return -0x1e;
    }
    if ((*(ulong *)(bytes_avail + 0xf0) < minimum) &&
       (sVar2 = extract_pack_stream(a,minimum), sVar2 < 0)) {
      return -0x1e;
    }
    if (*(ulong *)(bytes_avail + 0xf0) < minimum_local) {
      local_40 = *(archive_read **)(bytes_avail + 0xf0);
    }
    else {
      local_40 = (archive_read *)minimum_local;
    }
    *(undefined8 *)size_local = *(undefined8 *)(bytes_avail + 0xe0);
    *(long *)(bytes_avail + 0xe0) = (long)&(local_40->archive).magic + *(long *)(bytes_avail + 0xe0)
    ;
  }
  *(long *)(bytes_avail + 0xf0) = *(long *)(bytes_avail + 0xf0) - (long)local_40;
  return (ssize_t)local_40;
}

Assistant:

static ssize_t
get_uncompressed_data(struct archive_read *a, const void **buff, size_t size,
    size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		/* Copy mode. */

		*buff = __archive_read_ahead(a, minimum, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file data");
			return (ARCHIVE_FATAL);
		}
		if ((size_t)bytes_avail >
		    zip->uncompressed_buffer_bytes_remaining)
			bytes_avail = (ssize_t)
			    zip->uncompressed_buffer_bytes_remaining;
		if ((size_t)bytes_avail > size)
			bytes_avail = (ssize_t)size;

		zip->pack_stream_bytes_unconsumed = bytes_avail;
	} else if (zip->uncompressed_buffer_pointer == NULL) {
		/* Decompression has failed. */
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	} else {
		/* Packed mode. */
		if (minimum > zip->uncompressed_buffer_bytes_remaining) {
			/*
			 * If remaining uncompressed data size is less than
			 * the minimum size, fill the buffer up to the
			 * minimum size.
			 */
			if (extract_pack_stream(a, minimum) < 0)
				return (ARCHIVE_FATAL);
		}
		if (size > zip->uncompressed_buffer_bytes_remaining)
			bytes_avail = (ssize_t)
			    zip->uncompressed_buffer_bytes_remaining;
		else
			bytes_avail = (ssize_t)size;
		*buff = zip->uncompressed_buffer_pointer;
		zip->uncompressed_buffer_pointer += bytes_avail;
	}
	zip->uncompressed_buffer_bytes_remaining -= bytes_avail;
	return (bytes_avail);
}